

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O1

string * soul::TokenisedPathString::removeTopLevelNameIfPresent
                   (string *__return_storage_ptr__,string *path,string *nameToRemove)

{
  pointer __s1;
  ulong uVar1;
  ulong __n;
  int iVar2;
  size_type len;
  
  std::__cxx11::string::append((char *)nameToRemove);
  __s1 = (path->_M_dataplus)._M_p;
  uVar1 = path->_M_string_length;
  __n = nameToRemove->_M_string_length;
  if (uVar1 < __n) {
LAB_001c7739:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,__s1,__s1 + uVar1);
  }
  else {
    if (__n != 0) {
      iVar2 = bcmp(__s1,(nameToRemove->_M_dataplus)._M_p,__n);
      if (iVar2 != 0) goto LAB_001c7739;
    }
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)path);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string removeTopLevelNameIfPresent (const std::string& path, std::string nameToRemove)
    {
        nameToRemove += "::";

        if (choc::text::startsWith (path, nameToRemove))
            return path.substr (nameToRemove.length());

        return path;
    }